

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

char * lua_tolstring(lua_State *L,int idx,size_t *len)

{
  int iVar1;
  TValue *obj;
  
  obj = index2adr(L,idx);
  if (obj->tt != 4) {
    iVar1 = luaV_tostring(L,obj);
    if (iVar1 == 0) {
      if (len != (size_t *)0x0) {
        *len = 0;
      }
      return (char *)0x0;
    }
    if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
      luaC_step(L);
    }
    obj = index2adr(L,idx);
  }
  if (len != (size_t *)0x0) {
    *len = (size_t)(((obj->value).gc)->h).metatable;
  }
  return (char *)&(((obj->value).gc)->h).array;
}

Assistant:

static const char*lua_tolstring(lua_State*L,int idx,size_t*len){
StkId o=index2adr(L,idx);
if(!ttisstring(o)){
if(!luaV_tostring(L,o)){
if(len!=NULL)*len=0;
return NULL;
}
luaC_checkGC(L);
o=index2adr(L,idx);
}
if(len!=NULL)*len=tsvalue(o)->len;
return svalue(o);
}